

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

TestReturnValue __thiscall
embree::NewDeleteGeometryTest::run(NewDeleteGeometryTest *this,VerifyApplication *state,bool silent)

{
  _func_int **pp_Var1;
  __int_type _Var2;
  int iVar3;
  undefined8 uVar4;
  RTCDevice pRVar5;
  RTCScene pRVar6;
  ostream *this_00;
  ulong uVar7;
  byte in_DL;
  long in_RSI;
  Test *in_RDI;
  float fVar8;
  size_t i_22;
  Vec3fa pos;
  int index;
  size_t j;
  size_t i_1;
  Sphere spheres [128];
  size_t i;
  uint geom [128];
  VerifyScene scene;
  RTCDeviceRef device;
  string cfg;
  size_t i_21;
  size_t i_20;
  size_t i_19;
  size_t i_18;
  size_t i_17;
  size_t i_16;
  size_t i_15;
  size_t i_14;
  size_t i_13;
  size_t i_12;
  size_t i_11;
  size_t i_10;
  size_t i_9;
  size_t i_8;
  size_t i_7;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *in_stack_ffffffffffffe4a8;
  VerifyScene *in_stack_ffffffffffffe4b0;
  RTCDeviceRef *in_stack_ffffffffffffe4d0;
  VerifyScene *in_stack_ffffffffffffe4d8;
  SceneFlags in_stack_ffffffffffffe4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe4e8;
  Sphere *in_stack_ffffffffffffe4f8;
  Sphere *pSVar9;
  RTCDevice in_stack_ffffffffffffe500;
  RandomSampler *in_stack_ffffffffffffe508;
  VerifyScene *in_stack_ffffffffffffe510;
  VerifyScene *pVVar10;
  undefined8 in_stack_ffffffffffffe528;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *ppVar11;
  size_t in_stack_ffffffffffffe538;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *in_stack_ffffffffffffe540;
  RandomSampler *in_stack_ffffffffffffe548;
  undefined4 in_stack_ffffffffffffe550;
  RTCBuildQuality in_stack_ffffffffffffe554;
  RandomSampler *in_stack_ffffffffffffe558;
  RandomSampler *pRVar12;
  VerifyScene *in_stack_ffffffffffffe560;
  size_t in_stack_ffffffffffffe568;
  undefined1 *in_stack_ffffffffffffe570;
  float r;
  undefined1 *puVar13;
  RandomSampler *in_stack_ffffffffffffe578;
  undefined4 in_stack_ffffffffffffe580;
  RTCBuildQuality in_stack_ffffffffffffe584;
  RandomSampler *in_stack_ffffffffffffe588;
  VerifyScene *in_stack_ffffffffffffe590;
  RTCBuildQuality in_stack_ffffffffffffe59c;
  RandomSampler *in_stack_ffffffffffffe5a0;
  VerifyScene *in_stack_ffffffffffffe5a8;
  float in_stack_ffffffffffffe5b4;
  Vec3fa *in_stack_ffffffffffffe5b8;
  Vec3fa *pVVar14;
  RandomSampler *in_stack_ffffffffffffe5c0;
  RandomSampler *in_stack_ffffffffffffe5c8;
  VerifyScene *in_stack_ffffffffffffe5d0;
  avector<Vec3fa> *in_stack_ffffffffffffe5d8;
  Sphere *local_1a00;
  size_t in_stack_ffffffffffffe620;
  float in_stack_ffffffffffffe628;
  undefined4 in_stack_ffffffffffffe62c;
  Sphere local_19c8;
  undefined8 local_19a0;
  RTCSceneRef in_stack_ffffffffffffe670;
  float local_1988;
  RTCBuildQuality in_stack_ffffffffffffe67c;
  pointer in_stack_ffffffffffffe680;
  undefined1 local_1978 [8];
  __atomic_base<unsigned_long> in_stack_ffffffffffffe690;
  avector<Vec3fa> *in_stack_ffffffffffffe698;
  RTCSceneRef in_stack_ffffffffffffe6a0;
  float local_1958;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> local_1948 [2];
  float local_1928;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> local_1918;
  undefined8 local_1908;
  undefined8 local_1900;
  float local_18f8;
  undefined1 local_18e8 [56];
  pointer local_18b0;
  undefined8 local_18a8;
  undefined8 local_18a0;
  float local_1898;
  undefined1 local_1888 [48];
  undefined1 local_1858 [48];
  undefined1 local_1828 [56];
  pointer local_17f0;
  undefined8 local_17e8;
  undefined8 local_17e0;
  float local_17d8;
  undefined1 local_17c8 [16];
  string local_17b8;
  ulong local_1798;
  ulong local_1790;
  Sphere local_1788 [128];
  Sphere aSStack_788 [16];
  _func_int **local_570;
  VerifyScene local_568;
  RTCDeviceRef local_528 [3];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [39];
  byte local_4a9;
  long local_4a8;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined1 *local_480;
  undefined4 local_474;
  undefined1 *local_470;
  undefined1 *local_468;
  undefined8 *local_460;
  undefined1 *local_458;
  undefined4 local_44c;
  undefined8 *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_428;
  undefined1 *local_420;
  VerifyScene *local_418;
  Vec3fa *local_408;
  RandomSampler *local_3f8;
  RandomSampler *local_3e8;
  undefined1 *local_3d8;
  RandomSampler *local_3c8;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_3b8;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_3a8;
  VerifyScene *local_398;
  Sphere *local_388;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 local_328;
  ulong local_2f8;
  Sphere *local_2f0;
  Sphere *local_2d8;
  __atomic_base<unsigned_long> local_2a8;
  VerifyScene *local_2a0;
  VerifyScene *local_288;
  Node *local_258;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_250;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_238;
  Node *local_208;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *local_1e8;
  ulong local_1b8;
  RandomSampler *local_1b0;
  RandomSampler *local_198;
  pointer local_168;
  undefined1 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 *local_148;
  ulong local_118;
  RandomSampler *local_110;
  RandomSampler *local_f8;
  __atomic_base<unsigned_long> local_c8;
  RandomSampler *local_c0;
  RTCDeviceRef *local_b8;
  RTCScene local_b0;
  RandomSampler *local_a8;
  ulong local_78;
  Vec3fa *local_70;
  Vec3fa *local_58;
  pointer local_28;
  VerifyScene *local_20;
  undefined8 local_18;
  undefined8 local_10;
  VerifyScene *local_8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffe528 >> 0x20);
  local_4a9 = in_DL & 1;
  local_4a8 = in_RSI;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4d8,(char *)in_stack_ffffffffffffe4d0);
  stringOfISA_abi_cxx11_(iVar3);
  std::operator+(in_stack_ffffffffffffe4e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e0);
  std::__cxx11::string::~string(local_510);
  std::__cxx11::string::~string(local_4f0);
  uVar4 = std::__cxx11::string::c_str();
  pRVar5 = (RTCDevice)rtcNewDevice(uVar4);
  RTCDeviceRef::RTCDeviceRef(local_528,pRVar5);
  pRVar5 = RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_528);
  rtcGetDeviceError(pRVar5);
  errorHandler(in_stack_ffffffffffffe680,in_stack_ffffffffffffe67c,
               (char *)in_stack_ffffffffffffe670.scene);
  local_570 = in_RDI[1].super_RefCount._vptr_RefCount;
  VerifyScene::VerifyScene
            (in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0,in_stack_ffffffffffffe4e0);
  RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_528);
  AssertNoError(in_stack_ffffffffffffe500);
  for (aSStack_788[0].pos.field_0._8_8_ = 0; (ulong)aSStack_788[0].pos.field_0._8_8_ < 0x80;
      aSStack_788[0].pos.field_0._8_8_ = aSStack_788[0].pos.field_0._8_8_ + 1) {
    (&aSStack_788[0].r)[aSStack_788[0].pos.field_0._8_8_] = -NAN;
  }
  local_1a00 = local_1788;
  do {
    Sphere::Sphere(local_1a00);
    local_1a00 = local_1a00 + 1;
  } while (local_1a00 != aSStack_788);
  memset(local_1788,0,0x1000);
  for (local_1790 = 0; fVar8 = *(float *)(local_4a8 + 0xa8) * 50.0, uVar7 = (ulong)fVar8,
      local_1790 < (uVar7 | (long)(fVar8 - 9.223372e+18) & (long)uVar7 >> 0x3f);
      local_1790 = local_1790 + 1) {
    for (local_1798 = 0; local_1798 < 10; local_1798 = local_1798 + 1) {
      iVar3 = VerifyApplication::Test::random_int(in_RDI);
      local_17b8.field_2._12_4_ = iVar3 % 0x80;
      VerifyApplication::Test::random_Vec3fa((Test *)local_17c8);
      local_470 = local_17c8 + 0x10;
      local_474 = 0x42c80000;
      local_480 = local_17c8;
      local_448 = &local_498;
      local_44c = 0x42c80000;
      local_328 = 0x42c80000;
      local_338 = 0x42c80000;
      uStack_334 = 0x42c80000;
      uStack_330 = 0x42c80000;
      uStack_32c = 0x42c80000;
      local_498 = 0x42c8000042c80000;
      uStack_490 = 0x42c8000042c80000;
      local_458 = local_17c8 + 0x10;
      local_460 = &local_498;
      local_468 = local_17c8;
      local_348 = 0x42c8000042c80000;
      uStack_340 = 0x42c8000042c80000;
      local_358 = (_func_int **)local_17c8._0_8_;
      pp_Var1 = local_358;
      uStack_350 = local_17c8._8_8_;
      _Var2 = uStack_350;
      local_358._0_4_ = (float)local_17c8._0_8_;
      local_358._4_4_ = SUB84(local_17c8._0_8_,4);
      uStack_350._0_4_ = (float)local_17c8._8_8_;
      uStack_350._4_4_ = SUB84(local_17c8._8_8_,4);
      local_360 = local_17c8 + 0x10;
      local_378 = (float)local_358 * 100.0;
      fStack_374 = local_358._4_4_ * 100.0;
      fStack_370 = (float)uStack_350 * 100.0;
      fStack_36c = uStack_350._4_4_ * 100.0;
      local_17b8._4_4_ = local_358._4_4_ * 100.0;
      local_17b8._0_4_ = (float)local_358 * 100.0;
      local_17b8._M_string_length = CONCAT44(uStack_350._4_4_ * 100.0,(float)uStack_350 * 100.0);
      local_358 = pp_Var1;
      uStack_350 = _Var2;
      if ((&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] == -NAN) {
        iVar3 = VerifyApplication::Test::random_int(in_RDI);
        fVar8 = (float)((ulong)in_stack_ffffffffffffe548 >> 0x20);
        r = (float)((ulong)in_stack_ffffffffffffe570 >> 0x20);
        switch(iVar3 % 0xb) {
        case 0:
          in_stack_ffffffffffffe5d8 = (avector<Vec3fa> *)&in_RDI->sampler;
          local_440 = local_1828 + 0x30;
          local_17f0 = (pointer)0x0;
          local_17e8 = 0;
          local_17e0 = 0;
          in_stack_ffffffffffffe4b0 = (VerifyScene *)(local_1828 + 0x30);
          in_stack_ffffffffffffe4a8 =
               (pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)0xffffffffffffffff;
          VerifyScene::addSphere
                    (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588,in_stack_ffffffffffffe584,
                     (Vec3fa *)in_stack_ffffffffffffe578,r,in_stack_ffffffffffffe568,
                     in_stack_ffffffffffffe620,
                     (avector<Vec3fa> *)
                     CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628));
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = local_17d8;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          pVVar10 = (VerifyScene *)(local_1828 + 0x30);
          for (local_28 = (pointer)0x0; local_28 < local_17f0;
              local_28 = (pointer)((long)&local_28->ptr + 1)) {
          }
          local_18 = local_17e8;
          local_10 = local_17e0;
          local_418 = pVVar10;
          local_20 = pVVar10;
          local_8 = pVVar10;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe5d0 = pVVar10;
          (pVVar10->scene).scene = (RTCScene)0x0;
          pVVar10->device = (RTCDeviceRef *)0x0;
          (pVVar10->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
          break;
        case 1:
          in_stack_ffffffffffffe5c0 = &in_RDI->sampler;
          VerifyApplication::Test::random_motion_vector
                    ((Test *)CONCAT44(in_stack_ffffffffffffe554,in_stack_ffffffffffffe550),fVar8);
          in_stack_ffffffffffffe4b0 = (VerifyScene *)local_1828;
          in_stack_ffffffffffffe4a8 =
               (pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)0xffffffffffffffff;
          VerifyScene::addSphere
                    (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588,in_stack_ffffffffffffe584,
                     (Vec3fa *)in_stack_ffffffffffffe578,
                     (float)((ulong)in_stack_ffffffffffffe570 >> 0x20),in_stack_ffffffffffffe568,
                     in_stack_ffffffffffffe620,
                     (avector<Vec3fa> *)
                     CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628));
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = (float)local_1828._32_4_;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          pVVar14 = (Vec3fa *)local_1828;
          for (local_78 = 0; local_78 < (ulong)local_1828._8_8_; local_78 = local_78 + 1) {
          }
          local_408 = pVVar14;
          local_70 = pVVar14;
          local_58 = pVVar14;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe5b8 = pVVar14;
          *(undefined8 *)((long)&pVVar14[1].field_0 + 8) = 0;
          *(undefined8 *)&pVVar14[1].field_0 = 0;
          *(undefined8 *)((long)&pVVar14->field_0 + 8) = 0;
          break;
        case 2:
          in_stack_ffffffffffffe5a8 = (VerifyScene *)&in_RDI->sampler;
          local_438 = local_1858;
          local_1858._8_8_ = 0;
          local_1858._16_8_ = (RTCDeviceRef *)0x0;
          local_1858._24_8_ = (RTCScene)0x0;
          in_stack_ffffffffffffe4b0 = (VerifyScene *)local_1858;
          in_stack_ffffffffffffe4a8 =
               (pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)0xffffffffffffffff;
          VerifyScene::addQuadSphere
                    (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588,in_stack_ffffffffffffe584,
                     (Vec3fa *)in_stack_ffffffffffffe578,r,in_stack_ffffffffffffe568,
                     in_stack_ffffffffffffe620,
                     (avector<Vec3fa> *)
                     CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628));
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = (float)local_1858._32_4_;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          pRVar12 = (RandomSampler *)local_1858;
          for (local_c8._M_i = 0; local_c8._M_i < (ulong)local_1858._8_8_;
              local_c8._M_i = local_c8._M_i + 1) {
          }
          local_b8 = (RTCDeviceRef *)local_1858._16_8_;
          local_b0 = (RTCScene)local_1858._24_8_;
          local_3f8 = pRVar12;
          local_c0 = pRVar12;
          local_a8 = pRVar12;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe5a0 = pRVar12;
          *(undefined8 *)(pRVar12 + 6) = 0;
          *(undefined8 *)(pRVar12 + 4) = 0;
          *(undefined8 *)(pRVar12 + 2) = 0;
          break;
        case 3:
          in_stack_ffffffffffffe590 = (VerifyScene *)&in_RDI->sampler;
          VerifyApplication::Test::random_motion_vector
                    ((Test *)CONCAT44(in_stack_ffffffffffffe554,in_stack_ffffffffffffe550),fVar8);
          in_stack_ffffffffffffe4b0 = (VerifyScene *)local_1888;
          in_stack_ffffffffffffe4a8 =
               (pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)0xffffffffffffffff;
          VerifyScene::addQuadSphere
                    (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588,in_stack_ffffffffffffe584,
                     (Vec3fa *)in_stack_ffffffffffffe578,
                     (float)((ulong)in_stack_ffffffffffffe570 >> 0x20),in_stack_ffffffffffffe568,
                     in_stack_ffffffffffffe620,
                     (avector<Vec3fa> *)
                     CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628));
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = (float)local_1888._32_4_;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          pRVar12 = (RandomSampler *)local_1888;
          for (local_118 = 0; local_118 < (ulong)local_1888._8_8_; local_118 = local_118 + 1) {
          }
          local_3e8 = pRVar12;
          local_110 = pRVar12;
          local_f8 = pRVar12;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe588 = pRVar12;
          *(undefined8 *)(pRVar12 + 6) = 0;
          *(undefined8 *)(pRVar12 + 4) = 0;
          *(undefined8 *)(pRVar12 + 2) = 0;
          break;
        case 4:
          in_stack_ffffffffffffe578 = &in_RDI->sampler;
          local_430 = local_18e8 + 0x30;
          local_18b0 = (pointer)0x0;
          local_18a8 = 0;
          local_18a0 = 0;
          in_stack_ffffffffffffe4b0 = (VerifyScene *)(local_18e8 + 0x30);
          in_stack_ffffffffffffe4a8 =
               (pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)0xffffffffffffffff;
          VerifyScene::addGridSphere
                    (in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe554,
                     (Vec3fa *)in_stack_ffffffffffffe548,
                     (float)((ulong)in_stack_ffffffffffffe540 >> 0x20),in_stack_ffffffffffffe538,
                     (size_t)in_stack_ffffffffffffe5d0,in_stack_ffffffffffffe5d8);
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = local_1898;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          puVar13 = local_18e8 + 0x30;
          for (local_168 = (pointer)0x0; local_168 < local_18b0;
              local_168 = (pointer)((long)&local_168->ptr + 1)) {
          }
          local_158 = local_18a8;
          local_150 = local_18a0;
          local_3d8 = puVar13;
          local_160 = puVar13;
          local_148 = puVar13;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe570 = puVar13;
          *(undefined8 *)(puVar13 + 0x18) = 0;
          *(undefined8 *)(puVar13 + 0x10) = 0;
          *(undefined8 *)(puVar13 + 8) = 0;
          break;
        case 5:
          in_stack_ffffffffffffe560 = (VerifyScene *)&in_RDI->sampler;
          VerifyApplication::Test::random_motion_vector
                    ((Test *)CONCAT44(in_stack_ffffffffffffe554,in_stack_ffffffffffffe550),fVar8);
          in_stack_ffffffffffffe4b0 = (VerifyScene *)local_18e8;
          in_stack_ffffffffffffe4a8 =
               (pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)0xffffffffffffffff;
          VerifyScene::addGridSphere
                    (in_stack_ffffffffffffe560,in_stack_ffffffffffffe558,in_stack_ffffffffffffe554,
                     (Vec3fa *)in_stack_ffffffffffffe548,
                     (float)((ulong)in_stack_ffffffffffffe540 >> 0x20),in_stack_ffffffffffffe538,
                     (size_t)in_stack_ffffffffffffe5d0,in_stack_ffffffffffffe5d8);
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = (float)local_18e8._32_4_;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          pRVar12 = (RandomSampler *)local_18e8;
          for (local_1b8 = 0; local_1b8 < (ulong)local_18e8._8_8_; local_1b8 = local_1b8 + 1) {
          }
          local_3c8 = pRVar12;
          local_1b0 = pRVar12;
          local_198 = pRVar12;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe558 = pRVar12;
          *(undefined8 *)(pRVar12 + 6) = 0;
          *(undefined8 *)(pRVar12 + 4) = 0;
          *(undefined8 *)(pRVar12 + 2) = 0;
          break;
        case 6:
          in_stack_ffffffffffffe548 = &in_RDI->sampler;
          local_428 = &local_1918;
          local_1918.second.ptr = (Node *)0x0;
          local_1908 = 0;
          local_1900 = 0;
          in_stack_ffffffffffffe4a8 = &local_1918;
          VerifyScene::addHair
                    (in_stack_ffffffffffffe5a8,in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe59c,
                     (Vec3fa *)in_stack_ffffffffffffe590,
                     (float)((ulong)in_stack_ffffffffffffe588 >> 0x20),
                     SUB84(in_stack_ffffffffffffe588,0),
                     CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580),
                     (avector<Vec3fa> *)in_stack_ffffffffffffe6a0.scene);
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = local_18f8;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          ppVar11 = &local_1918;
          for (local_208 = (Node *)0x0; local_208 < local_1918.second.ptr;
              local_208 = (Node *)((long)&(local_208->super_RefCount)._vptr_RefCount + 1)) {
          }
          local_1f8 = local_1908;
          local_1f0 = local_1900;
          local_3b8 = ppVar11;
          local_200 = ppVar11;
          local_1e8 = ppVar11;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe540 = ppVar11;
          ppVar11[1].second.ptr = (Node *)0x0;
          *(undefined8 *)(ppVar11 + 1) = 0;
          (ppVar11->second).ptr = (Node *)0x0;
          break;
        case 7:
          VerifyApplication::Test::random_motion_vector
                    ((Test *)CONCAT44(in_stack_ffffffffffffe554,in_stack_ffffffffffffe550),fVar8);
          in_stack_ffffffffffffe4a8 = local_1948;
          VerifyScene::addHair
                    (in_stack_ffffffffffffe5a8,in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe59c,
                     (Vec3fa *)in_stack_ffffffffffffe590,
                     (float)((ulong)in_stack_ffffffffffffe588 >> 0x20),
                     SUB84(in_stack_ffffffffffffe588,0),
                     CONCAT44(in_stack_ffffffffffffe584,in_stack_ffffffffffffe580),
                     (avector<Vec3fa> *)in_stack_ffffffffffffe6a0.scene);
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = local_1928;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          ppVar11 = local_1948;
          for (local_258 = (Node *)0x0; local_258 < local_1948[0].second.ptr;
              local_258 = (Node *)((long)&(local_258->super_RefCount)._vptr_RefCount + 1)) {
          }
          local_3a8 = ppVar11;
          local_250 = ppVar11;
          local_238 = ppVar11;
          alignedFree(in_stack_ffffffffffffe4a8);
          ppVar11[1].second.ptr = (Node *)0x0;
          *(undefined8 *)(ppVar11 + 1) = 0;
          (ppVar11->second).ptr = (Node *)0x0;
          break;
        case 8:
          local_420 = local_1978;
          in_stack_ffffffffffffe690._M_i = 0;
          in_stack_ffffffffffffe698 = (avector<Vec3fa> *)0x0;
          in_stack_ffffffffffffe6a0.scene = (RTCScene)0x0;
          in_stack_ffffffffffffe4b0 = (VerifyScene *)local_1978;
          in_stack_ffffffffffffe4a8 =
               (pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)0xffffffffffffffff;
          VerifyScene::addSubdivSphere
                    (in_stack_ffffffffffffe5d0,in_stack_ffffffffffffe5c8,
                     (RTCBuildQuality)((ulong)in_stack_ffffffffffffe5c0 >> 0x20),
                     in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b4,
                     (size_t)in_stack_ffffffffffffe5a8,
                     (float)((ulong)in_stack_ffffffffffffe5a0 >> 0x20),0,(avector<Vec3fa> *)0x0);
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = local_1958;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          pVVar10 = (VerifyScene *)local_1978;
          for (local_2a8._M_i = 0; local_2a8._M_i < in_stack_ffffffffffffe690._M_i;
              local_2a8._M_i = local_2a8._M_i + 1) {
          }
          local_398 = pVVar10;
          local_2a0 = pVVar10;
          local_288 = pVVar10;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe510 = pVVar10;
          (pVVar10->scene).scene = (RTCScene)0x0;
          pVVar10->device = (RTCDeviceRef *)0x0;
          (pVVar10->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
          break;
        case 9:
          in_stack_ffffffffffffe500 = (RTCDevice)&in_RDI->sampler;
          VerifyApplication::Test::random_motion_vector
                    ((Test *)CONCAT44(in_stack_ffffffffffffe554,in_stack_ffffffffffffe550),fVar8);
          in_stack_ffffffffffffe4b0 = (VerifyScene *)&stack0xffffffffffffe658;
          in_stack_ffffffffffffe4a8 =
               (pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)0xffffffffffffffff;
          VerifyScene::addSubdivSphere
                    (in_stack_ffffffffffffe5d0,in_stack_ffffffffffffe5c8,
                     (RTCBuildQuality)((ulong)in_stack_ffffffffffffe5c0 >> 0x20),
                     in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b4,
                     (size_t)in_stack_ffffffffffffe5a8,
                     (float)((ulong)in_stack_ffffffffffffe5a0 >> 0x20),
                     in_stack_ffffffffffffe690._M_i,in_stack_ffffffffffffe698);
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = local_1988;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
          pSVar9 = (Sphere *)&stack0xffffffffffffe658;
          for (local_2f8 = 0; local_2f8 < (ulong)local_19a0; local_2f8 = local_2f8 + 1) {
          }
          local_388 = pSVar9;
          local_2f0 = pSVar9;
          local_2d8 = pSVar9;
          alignedFree(in_stack_ffffffffffffe4a8);
          in_stack_ffffffffffffe4f8 = pSVar9;
          *(undefined8 *)&pSVar9->field_0x18 = 0;
          *(undefined8 *)&pSVar9->r = 0;
          *(undefined8 *)((long)&(pSVar9->pos).field_0 + 8) = 0;
          break;
        case 10:
          Sphere::Sphere(&local_19c8,(Vec3fa *)(local_17c8 + 0x10),2.0);
          Sphere::operator=(local_1788 + (int)local_17b8.field_2._12_4_,&local_19c8);
          VerifyScene::addUserGeometryEmpty
                    (in_stack_ffffffffffffe510,in_stack_ffffffffffffe508,
                     (RTCBuildQuality)((ulong)in_stack_ffffffffffffe500 >> 0x20),
                     in_stack_ffffffffffffe4f8);
          (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = in_stack_ffffffffffffe628;
          std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
                    (in_stack_ffffffffffffe4a8);
        }
        RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_528);
        AssertNoError(in_stack_ffffffffffffe500);
      }
      else {
        pRVar6 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_568);
        rtcDetachGeometry(pRVar6,(&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_]);
        RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_528);
        AssertNoError(in_stack_ffffffffffffe500);
        (&aSStack_788[0].r)[(int)local_17b8.field_2._12_4_] = -NAN;
      }
    }
    pRVar6 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_568);
    rtcCommitScene(pRVar6);
    RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_528);
    AssertNoError(in_stack_ffffffffffffe500);
    pRVar6 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_568);
    rtcCommitScene(pRVar6);
    RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_528);
    AssertNoError(in_stack_ffffffffffffe500);
    if ((local_1790 & 1) == 0) {
      this_00 = std::operator<<((ostream *)&std::cout,".");
      std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
    }
  }
  for (uVar7 = 0; uVar7 < 0x80; uVar7 = uVar7 + 1) {
    if ((&aSStack_788[0].r)[uVar7] != -NAN) {
      pRVar6 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_568);
      rtcDetachGeometry(pRVar6,(&aSStack_788[0].r)[uVar7]);
    }
  }
  pRVar6 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_568);
  rtcCommitScene(pRVar6);
  RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_528);
  AssertNoError(in_stack_ffffffffffffe500);
  pRVar6 = VerifyScene::operator_cast_to_RTCSceneTy_(&local_568);
  rtcCommitScene(pRVar6);
  RTCDeviceRef::operator_cast_to_RTCDeviceTy_(local_528);
  AssertNoError(in_stack_ffffffffffffe500);
  VerifyScene::~VerifyScene(in_stack_ffffffffffffe4b0);
  RTCDeviceRef::~RTCDeviceRef((RTCDeviceRef *)in_stack_ffffffffffffe4b0);
  std::__cxx11::string::~string(local_4d0);
  return PASSED;
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      VerifyScene scene(device,sflags);
      AssertNoError(device);
      unsigned int geom[128];
      for (size_t i=0; i<128; i++) geom[i] = -1;
      Sphere spheres[128];
      memset(spheres,0,sizeof(spheres));
      
      for (size_t i=0; i<size_t(50*state->intensity); i++) 
      {
        for (size_t j=0; j<10; j++) {
          int index = random_int()%128;
          Vec3fa pos = 100.0f*random_Vec3fa();
          if (geom[index] == -1) {
            switch (random_int()%11) {
            case 0: geom[index] = scene.addSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 1: geom[index] = scene.addSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 2: geom[index] = scene.addQuadSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 3: geom[index] = scene.addQuadSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 4: geom[index] = scene.addGridSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 5: geom[index] = scene.addGridSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 6: geom[index] = scene.addHair(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,1.0f,2.0f,10).first; break;
            case 7: geom[index] = scene.addHair(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,1.0f,2.0f,10,random_motion_vector(1.0f)).first; break;
            case 8: geom[index] = scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,4,4).first; break;
            case 9: geom[index] = scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,4,4,-1,random_motion_vector(1.0f)).first; break;
            case 10: 
              spheres[index] = Sphere(pos,2.0f);
              geom[index] = scene.addUserGeometryEmpty(sampler,RTC_BUILD_QUALITY_MEDIUM,&spheres[index]).first; break;
            }
            AssertNoError(device);
          }
          else { 
            rtcDetachGeometry(scene,geom[index]);     
            AssertNoError(device);
            geom[index] = -1; 
          }
        }
        rtcCommitScene(scene);
        AssertNoError(device);
        rtcCommitScene(scene);
        AssertNoError(device);
        if (i%2 == 0) std::cout << "." << std::flush;
      }
      
      /* now delete all geometries */
      for (size_t i=0; i<128; i++) 
        if (geom[i] != -1) rtcDetachGeometry(scene,geom[i]);
      rtcCommitScene(scene);
      AssertNoError(device);

      rtcCommitScene (scene);
      AssertNoError(device);

      return VerifyApplication::PASSED;
    }